

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

uint EatNumber(StringRef *Str)

{
  bool bVar1;
  char cVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  uint local_6c;
  uint Result;
  StringRef *Str_local;
  unsigned_long local_50 [3];
  StringRef *local_38;
  undefined1 local_30 [16];
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  bVar1 = false;
  if (Str->Length != 0) {
    cVar2 = llvm::StringRef::operator[](Str,0);
    bVar1 = false;
    if ('/' < cVar2) {
      cVar2 = llvm::StringRef::operator[](Str,0);
      bVar1 = false;
      if (cVar2 < ':') {
        bVar1 = true;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("!Str.empty() && Str[0] >= \'0\' && Str[0] <= \'9\' && \"Not a number\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                  ,0x3c9,"unsigned int EatNumber(StringRef &)");
  }
  local_6c = 0;
  do {
    cVar2 = llvm::StringRef::operator[](Str,0);
    local_6c = cVar2 + -0x30 + local_6c * 10;
    local_50[2] = 1;
    local_50[1] = 0xffffffffffffffff;
    local_38 = Str;
    puVar3 = std::min<unsigned_long>(local_50 + 2,&Str->Length);
    local_50[2] = *puVar3;
    pcVar4 = Str->Data + local_50[2];
    local_50[0] = Str->Length - local_50[2];
    puVar3 = std::min<unsigned_long>(local_50 + 1,local_50);
    local_20 = *puVar3;
    local_10 = local_30;
    Str->Data = pcVar4;
    Str->Length = local_20;
    bVar1 = false;
    local_18 = pcVar4;
    if (Str->Length != 0) {
      cVar2 = llvm::StringRef::operator[](Str,0);
      bVar1 = false;
      if ('/' < cVar2) {
        cVar2 = llvm::StringRef::operator[](Str,0);
        bVar1 = cVar2 < ':';
      }
    }
  } while (bVar1);
  return local_6c;
}

Assistant:

static unsigned EatNumber(StringRef &Str) {
  assert(!Str.empty() && Str[0] >= '0' && Str[0] <= '9' && "Not a number");
  unsigned Result = 0;

  do {
    // Consume the leading digit.
    Result = Result*10 + (Str[0] - '0');

    // Eat the digit.
    Str = Str.substr(1);
  } while (!Str.empty() && Str[0] >= '0' && Str[0] <= '9');

  return Result;
}